

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadCordFallback
          (EpsCopyInputStream *this,char *ptr,int size,Cord *cord)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  string_view src;
  string_view src_00;
  anon_class_8_1_898a5c9c local_48;
  LogMessageFatal local_40;
  
  iVar1 = (int)this->buffer_end_ - (int)ptr;
  if (this->zcis_ == (ZeroCopyInputStream *)0x0) {
    if (size <= iVar1 + 0x10) {
      src_00._M_str = ptr;
      src_00._M_len = (long)size;
      absl::lts_20250127::Cord::operator=(cord,src_00);
      return ptr + size;
    }
    local_48.cord = cord;
    iVar1 = BytesAvailable(this,ptr);
    while (iVar4 = size - iVar1, iVar4 != 0 && iVar1 <= size) {
      if (this->next_chunk_ == (char *)0x0) {
        return (char *)0x0;
      }
      ReadCordFallback::anon_class_8_1_898a5c9c::operator()(&local_48,ptr,iVar1);
      if (this->limit_ < 0x11) {
        return (char *)0x0;
      }
      pcVar2 = Next(this);
      if (pcVar2 == (char *)0x0) {
        return (char *)0x0;
      }
      ptr = pcVar2 + 0x10;
      iVar1 = BytesAvailable(this,ptr);
      size = iVar4;
      if (iVar4 <= iVar1) {
        ReadCordFallback::anon_class_8_1_898a5c9c::operator()(&local_48,ptr,iVar4);
        return ptr + iVar4;
      }
    }
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
    pcVar2 = "size > chunk_size";
    iVar1 = 0x1ab;
    goto LAB_00214780;
  }
  iVar4 = this->limit_ + iVar1;
  iVar5 = iVar4 - size;
  if (iVar4 < size) {
    return (char *)0x0;
  }
  iVar4 = iVar1 + 0x10;
  pcVar3 = this->patch_buffer_;
  if (iVar4 < 0x21 && (ulong)((long)ptr - (long)pcVar3) < 0x21) {
    if ((iVar1 == 0) && (this->next_chunk_ != pcVar3 && this->next_chunk_ != (char *)0x0)) {
      absl::lts_20250127::Cord::Clear(cord);
      iVar4 = this->size_;
    }
    else {
      size = size - iVar4;
      pcVar2 = absl::lts_20250127::log_internal::Check_GTImpl(size,0,"size > 0");
      if (pcVar2 != (Nullable<const_char_*>)0x0) {
        pcVar3 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
        ;
        iVar1 = 0x17e;
LAB_00214780:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,pcVar3,iVar1,pcVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      src._M_len = (size_t)iVar4;
      src._M_str = ptr;
      absl::lts_20250127::Cord::operator=(cord,src);
      if (this->next_chunk_ == pcVar3) goto LAB_002146e8;
      if (this->next_chunk_ == (char *)0x0) {
        this->last_tag_minus_1_ = 1;
        return (char *)0x0;
      }
      if (this->size_ < 0x11) {
        pcVar3 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
        ;
        pcVar2 = "size_ > kSlopBytes";
        iVar1 = 0x189;
        goto LAB_00214780;
      }
      iVar4 = this->size_ + -0x10;
    }
  }
  else {
    absl::lts_20250127::Cord::Clear(cord);
  }
  StreamBackUp(this,iVar4);
LAB_002146e8:
  if (size <= this->overall_limit_) {
    this->overall_limit_ = this->overall_limit_ - size;
    iVar1 = (*this->zcis_->_vptr_ZeroCopyInputStream[6])(this->zcis_,cord,(ulong)(uint)size);
    if ((char)iVar1 != '\0') {
      pcVar2 = InitFrom(this,this->zcis_);
      uVar6 = iVar5 + ((int)pcVar2 - (int)this->buffer_end_);
      this->limit_ = uVar6;
      this->limit_end_ = this->buffer_end_ + (int)((int)uVar6 >> 0x1f & uVar6);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadCordFallback(const char* ptr, int size,
                                                 absl::Cord* cord) {
  if (zcis_ == nullptr) {
    int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
    if (size <= bytes_from_buffer) {
      *cord = absl::string_view(ptr, size);
      return ptr + size;
    }
    return AppendSize(ptr, size, [cord](const char* p, int s) {
      cord->Append(absl::string_view(p, s));
    });
  }
  int new_limit = buffer_end_ - ptr + limit_;
  if (size > new_limit) return nullptr;
  new_limit -= size;
  int bytes_from_buffer = buffer_end_ - ptr + kSlopBytes;
  const bool in_patch_buf = reinterpret_cast<uintptr_t>(ptr) -
                                reinterpret_cast<uintptr_t>(patch_buffer_) <=
                            kPatchBufferSize;
  if (bytes_from_buffer > kPatchBufferSize || !in_patch_buf) {
    cord->Clear();
    StreamBackUp(bytes_from_buffer);
  } else if (bytes_from_buffer == kSlopBytes && next_chunk_ != nullptr &&
             // Only backup if next_chunk_ points to a valid buffer returned by
             // ZeroCopyInputStream. This happens when NextStream() returns a
             // chunk that's smaller than or equal to kSlopBytes.
             next_chunk_ != patch_buffer_) {
    cord->Clear();
    StreamBackUp(size_);
  } else {
    size -= bytes_from_buffer;
    ABSL_DCHECK_GT(size, 0);
    *cord = absl::string_view(ptr, bytes_from_buffer);
    if (next_chunk_ == patch_buffer_) {
      // We have read to end of the last buffer returned by
      // ZeroCopyInputStream. So the stream is in the right position.
    } else if (next_chunk_ == nullptr) {
      // There is no remaining chunks. We can't read size.
      SetEndOfStream();
      return nullptr;
    } else {
      // Next chunk is already loaded
      ABSL_DCHECK(size_ > kSlopBytes);
      StreamBackUp(size_ - kSlopBytes);
    }
  }
  if (size > overall_limit_) return nullptr;
  overall_limit_ -= size;
  if (!zcis_->ReadCord(cord, size)) return nullptr;
  ptr = InitFrom(zcis_);
  limit_ = new_limit - static_cast<int>(buffer_end_ - ptr);
  limit_end_ = buffer_end_ + (std::min)(0, limit_);
  return ptr;
}